

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

QCborValue * __thiscall QCborContainerPrivate::extractAt(QCborContainerPrivate *this,qsizetype idx)

{
  bool bVar1;
  QFlagsStorage<QtCbor::Element::ValueFlag> QVar2;
  qsizetype qVar3;
  qint64 in_RDX;
  QCborContainerPrivate *in_RSI;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  Element in_stack_00000000;
  Element e;
  ValueFlag other;
  QCborContainerPrivate *this_00;
  QCborContainerPrivate *pQVar4;
  Type type;
  undefined4 in_stack_ffffffffffffffd8;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_20;
  undefined1 local_1c [4];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  pQVar4 = in_RSI;
  memset(local_1c,0,4);
  type = (Type)((ulong)pQVar4 >> 0x20);
  QFlags<QtCbor::Element::ValueFlag>::QFlags((QFlags<QtCbor::Element::ValueFlag> *)0x47bf6e);
  QtCbor::Element::Element
            ((Element *)this_00,(qint64)in_RDI,Integer,
             (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)SUB84((ulong)in_RSI >> 0x20,0));
  QList<QtCbor::Element>::operator[]((QList<QtCbor::Element> *)this_00,(qsizetype)in_RDI);
  qSwap<QtCbor::Element>((Element *)this_00,(Element *)in_RDI);
  other = (ValueFlag)((ulong)in_RDI >> 0x20);
  local_20.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
       (QFlagsStorage<QtCbor::Element::ValueFlag>)
       QFlags<QtCbor::Element::ValueFlag>::operator&
                 ((QFlags<QtCbor::Element::ValueFlag> *)this_00,other);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_20);
  if (bVar1) {
    if ((int)local_10 == 0xc0) {
      qVar3 = QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(local_18 + 0x28));
      if (qVar3 != 2) {
        deref(this_00);
        makeValue(type,in_RDX,in_RSI,(ContainerDisposition)((ulong)this_00 >> 0x20));
        goto LAB_0047c0a2;
      }
    }
    makeValue(type,in_RDX,in_RSI,(ContainerDisposition)((ulong)this_00 >> 0x20));
  }
  else {
    QVar2.i = (Int)QFlags<QtCbor::Element::ValueFlag>::operator&
                             ((QFlags<QtCbor::Element::ValueFlag> *)this_00,other);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&stack0xffffffffffffffdc);
    if (bVar1) {
      extractAt_complex((QCborContainerPrivate *)CONCAT44(QVar2.i,in_stack_ffffffffffffffd8),
                        in_stack_00000000);
    }
    else {
      makeValue(type,in_RDX,in_RSI,(ContainerDisposition)((ulong)this_00 >> 0x20));
    }
  }
LAB_0047c0a2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QCborValue *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue extractAt(qsizetype idx)
    {
        QtCbor::Element e;
        qSwap(e, elements[idx]);

        if (e.flags & QtCbor::Element::IsContainer) {
            if (e.type == QCborValue::Tag && e.container->elements.size() != 2) {
                // invalid tags can be created due to incomplete parsing
                e.container->deref();
                return makeValue(QCborValue::Invalid, 0, nullptr);
            }
            return makeValue(e.type, -1, e.container, MoveContainer);
        } else if (e.flags & QtCbor::Element::HasByteData) {
            return extractAt_complex(e);
        }
        return makeValue(e.type, e.value);
    }